

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Bool XML_ParserReset(XML_Parser parser,XML_Char *encodingName)

{
  tag *ptVar1;
  binding *pbVar2;
  open_internal_entity *poVar3;
  block *pbVar4;
  DTD *pDVar5;
  NAMED **ppNVar6;
  size_t sVar7;
  long lVar8;
  TAG *pTVar9;
  OPEN_INTERNAL_ENTITY *pOVar10;
  BINDING *pBVar11;
  TAG *tag;
  OPEN_INTERNAL_ENTITY *pOVar12;
  BINDING *pBVar13;
  BLOCK *pBVar14;
  OPEN_INTERNAL_ENTITY *openEntity;
  BLOCK *pBVar15;
  TAG *pTVar16;
  long lVar17;
  ulong uVar18;
  
  if (parser == (XML_Parser)0x0) {
    return '\0';
  }
  if (parser->m_parentParser != (XML_Parser)0x0) {
    return '\0';
  }
  if (parser->m_tagStack != (TAG *)0x0) {
    ptVar1 = parser->m_tagStack;
    pTVar16 = parser->m_freeTagList;
    do {
      pTVar9 = ptVar1;
      ptVar1 = pTVar9->parent;
      pTVar9->parent = pTVar16;
      if (pTVar9->bindings != (BINDING *)0x0) {
        pbVar2 = pTVar9->bindings;
        pBVar13 = parser->m_freeBindingList;
        do {
          pBVar11 = pbVar2;
          pbVar2 = pBVar11->nextTagBinding;
          pBVar11->nextTagBinding = pBVar13;
          pBVar13 = pBVar11;
        } while (pbVar2 != (binding *)0x0);
        parser->m_freeBindingList = pBVar11;
      }
      pTVar9->bindings = (BINDING *)0x0;
      pTVar16 = pTVar9;
    } while (ptVar1 != (tag *)0x0);
    parser->m_freeTagList = pTVar9;
  }
  if (parser->m_openInternalEntities != (OPEN_INTERNAL_ENTITY *)0x0) {
    poVar3 = parser->m_openInternalEntities;
    pOVar12 = parser->m_freeInternalEntities;
    do {
      pOVar10 = poVar3;
      poVar3 = pOVar10->next;
      pOVar10->next = pOVar12;
      pOVar12 = pOVar10;
    } while (poVar3 != (open_internal_entity *)0x0);
    parser->m_freeInternalEntities = pOVar10;
  }
  if (parser->m_inheritedBindings != (BINDING *)0x0) {
    pbVar2 = parser->m_inheritedBindings;
    pBVar13 = parser->m_freeBindingList;
    do {
      pBVar11 = pbVar2;
      pbVar2 = pBVar11->nextTagBinding;
      pBVar11->nextTagBinding = pBVar13;
      pBVar13 = pBVar11;
    } while (pbVar2 != (binding *)0x0);
    parser->m_freeBindingList = pBVar11;
  }
  (*(parser->m_mem).free_fcn)(parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease != (_func_void_void_ptr *)0x0) {
    (*parser->m_unknownEncodingRelease)(parser->m_unknownEncodingData);
  }
  pBVar15 = (parser->m_tempPool).blocks;
  pBVar14 = (parser->m_tempPool).freeBlocks;
  if (pBVar14 == (BLOCK *)0x0) {
LAB_003f80e7:
    (parser->m_tempPool).freeBlocks = pBVar15;
  }
  else {
    pbVar4 = pBVar15;
    if (pBVar15 != (BLOCK *)0x0) {
      do {
        pBVar15 = pbVar4;
        pbVar4 = pBVar15->next;
        pBVar15->next = pBVar14;
        pBVar14 = pBVar15;
      } while (pbVar4 != (block *)0x0);
      goto LAB_003f80e7;
    }
  }
  (parser->m_tempPool).blocks = (BLOCK *)0x0;
  (parser->m_tempPool).end = (XML_Char *)0x0;
  (parser->m_tempPool).ptr = (XML_Char *)0x0;
  (parser->m_tempPool).start = (XML_Char *)0x0;
  pBVar15 = (parser->m_temp2Pool).blocks;
  pBVar14 = (parser->m_temp2Pool).freeBlocks;
  if (pBVar14 == (BLOCK *)0x0) {
LAB_003f8136:
    (parser->m_temp2Pool).freeBlocks = pBVar15;
  }
  else {
    pbVar4 = pBVar15;
    if (pBVar15 != (BLOCK *)0x0) {
      do {
        pBVar15 = pbVar4;
        pbVar4 = pBVar15->next;
        pBVar15->next = pBVar14;
        pBVar14 = pBVar15;
      } while (pbVar4 != (block *)0x0);
      goto LAB_003f8136;
    }
  }
  (parser->m_temp2Pool).blocks = (BLOCK *)0x0;
  (parser->m_temp2Pool).end = (XML_Char *)0x0;
  (parser->m_temp2Pool).ptr = (XML_Char *)0x0;
  (parser->m_temp2Pool).start = (XML_Char *)0x0;
  (*(parser->m_mem).free_fcn)(parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = (XML_Char *)0x0;
  parserInit(parser,encodingName);
  pDVar5 = parser->m_dtd;
  ppNVar6 = (pDVar5->elementTypes).v;
  sVar7 = (pDVar5->elementTypes).size;
  for (lVar17 = 0; sVar7 << 3 != lVar17; lVar17 = lVar17 + 8) {
    lVar8 = *(long *)((long)ppNVar6 + lVar17);
    if ((lVar8 != 0) && (*(int *)(lVar8 + 0x1c) != 0)) {
      (*(parser->m_mem).free_fcn)(*(void **)(lVar8 + 0x20));
    }
  }
  if ((pDVar5->generalEntities).size != 0) {
    uVar18 = 0;
    do {
      (*((pDVar5->generalEntities).mem)->free_fcn)((pDVar5->generalEntities).v[uVar18]);
      (pDVar5->generalEntities).v[uVar18] = (NAMED *)0x0;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (pDVar5->generalEntities).size);
  }
  (pDVar5->generalEntities).used = 0;
  if ((pDVar5->elementTypes).size != 0) {
    uVar18 = 0;
    do {
      (*((pDVar5->elementTypes).mem)->free_fcn)((pDVar5->elementTypes).v[uVar18]);
      (pDVar5->elementTypes).v[uVar18] = (NAMED *)0x0;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (pDVar5->elementTypes).size);
  }
  (pDVar5->elementTypes).used = 0;
  if ((pDVar5->attributeIds).size != 0) {
    uVar18 = 0;
    do {
      (*((pDVar5->attributeIds).mem)->free_fcn)((pDVar5->attributeIds).v[uVar18]);
      (pDVar5->attributeIds).v[uVar18] = (NAMED *)0x0;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (pDVar5->attributeIds).size);
  }
  (pDVar5->attributeIds).used = 0;
  if ((pDVar5->prefixes).size != 0) {
    uVar18 = 0;
    do {
      (*((pDVar5->prefixes).mem)->free_fcn)((pDVar5->prefixes).v[uVar18]);
      (pDVar5->prefixes).v[uVar18] = (NAMED *)0x0;
      uVar18 = uVar18 + 1;
    } while (uVar18 < (pDVar5->prefixes).size);
  }
  (pDVar5->prefixes).used = 0;
  pBVar15 = (pDVar5->pool).blocks;
  pBVar14 = (pDVar5->pool).freeBlocks;
  if (pBVar14 == (BLOCK *)0x0) {
LAB_003f82b8:
    (pDVar5->pool).freeBlocks = pBVar15;
  }
  else {
    pbVar4 = pBVar15;
    if (pBVar15 != (BLOCK *)0x0) {
      do {
        pBVar15 = pbVar4;
        pbVar4 = pBVar15->next;
        pBVar15->next = pBVar14;
        pBVar14 = pBVar15;
      } while (pbVar4 != (block *)0x0);
      goto LAB_003f82b8;
    }
  }
  (pDVar5->pool).blocks = (BLOCK *)0x0;
  (pDVar5->pool).end = (XML_Char *)0x0;
  (pDVar5->pool).ptr = (XML_Char *)0x0;
  (pDVar5->pool).start = (XML_Char *)0x0;
  pBVar15 = (pDVar5->entityValuePool).blocks;
  pBVar14 = (pDVar5->entityValuePool).freeBlocks;
  if (pBVar14 != (BLOCK *)0x0) {
    pbVar4 = pBVar15;
    if (pBVar15 == (BLOCK *)0x0) goto LAB_003f830f;
    do {
      pBVar15 = pbVar4;
      pbVar4 = pBVar15->next;
      pBVar15->next = pBVar14;
      pBVar14 = pBVar15;
    } while (pbVar4 != (block *)0x0);
  }
  (pDVar5->entityValuePool).freeBlocks = pBVar15;
LAB_003f830f:
  (pDVar5->entityValuePool).blocks = (BLOCK *)0x0;
  (pDVar5->entityValuePool).end = (XML_Char *)0x0;
  (pDVar5->entityValuePool).ptr = (XML_Char *)0x0;
  (pDVar5->entityValuePool).start = (XML_Char *)0x0;
  (pDVar5->defaultPrefix).name = (XML_Char *)0x0;
  (pDVar5->defaultPrefix).binding = (BINDING *)0x0;
  pDVar5->in_eldecl = '\0';
  (*(parser->m_mem).free_fcn)(pDVar5->scaffIndex);
  pDVar5->scaffIndex = (int *)0x0;
  (*(parser->m_mem).free_fcn)(pDVar5->scaffold);
  pDVar5->scaffCount = 0;
  pDVar5->scaffLevel = 0;
  pDVar5->scaffold = (CONTENT_SCAFFOLD *)0x0;
  pDVar5->contentStringLen = 0;
  pDVar5->scaffSize = 0;
  pDVar5->keepProcessing = '\x01';
  pDVar5->hasParamEntityRefs = '\0';
  pDVar5->standalone = '\0';
  return '\x01';
}

Assistant:

XML_Bool XMLCALL
XML_ParserReset(XML_Parser parser, const XML_Char *encodingName)
{
  TAG *tStk;
  OPEN_INTERNAL_ENTITY *openEntityList;

  if (parser == NULL)
      return XML_FALSE;

  if (parser->m_parentParser)
    return XML_FALSE;
  /* move m_tagStack to m_freeTagList */
  tStk = parser->m_tagStack;
  while (tStk) {
    TAG *tag = tStk;
    tStk = tStk->parent;
    tag->parent = parser->m_freeTagList;
    moveToFreeBindingList(parser, tag->bindings);
    tag->bindings = NULL;
    parser->m_freeTagList = tag;
  }
  /* move m_openInternalEntities to m_freeInternalEntities */
  openEntityList = parser->m_openInternalEntities;
  while (openEntityList) {
    OPEN_INTERNAL_ENTITY *openEntity = openEntityList;
    openEntityList = openEntity->next;
    openEntity->next = parser->m_freeInternalEntities;
    parser->m_freeInternalEntities = openEntity;
  }
  moveToFreeBindingList(parser, parser->m_inheritedBindings);
  FREE(parser, parser->m_unknownEncodingMem);
  if (parser->m_unknownEncodingRelease)
    parser->m_unknownEncodingRelease(parser->m_unknownEncodingData);
  poolClear(&parser->m_tempPool);
  poolClear(&parser->m_temp2Pool);
  FREE(parser, (void *)parser->m_protocolEncodingName);
  parser->m_protocolEncodingName = NULL;
  parserInit(parser, encodingName);
  dtdReset(parser->m_dtd, &parser->m_mem);
  return XML_TRUE;
}